

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmCopyFileIfDifferent(char *name1,char *name2)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,name1,&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name2,&local_4a);
  cmsys::SystemTools::CopyFileIfDifferent(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static void CCONV cmCopyFileIfDifferent(const char* name1, const char* name2)
{
  cmSystemTools::CopyFileIfDifferent(name1, name2);
}